

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResultCollector.cpp
# Opt level: O0

void __thiscall CppUnit::TestResultCollector::reset(TestResultCollector *this)

{
  ExclusiveZone local_18;
  ExclusiveZone zone;
  TestResultCollector *this_local;
  
  zone.m_syncObject = (SynchronizationObject *)this;
  TestSuccessListener::reset(&this->super_TestSuccessListener);
  SynchronizedObject::ExclusiveZone::ExclusiveZone
            (&local_18,(this->super_TestSuccessListener).super_SynchronizedObject.m_syncObject);
  freeFailures(this);
  this->m_testErrors = 0;
  std::deque<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::clear(&this->m_tests);
  SynchronizedObject::ExclusiveZone::~ExclusiveZone(&local_18);
  return;
}

Assistant:

void 
TestResultCollector::reset()
{
  TestSuccessListener::reset();

  ExclusiveZone zone( m_syncObject ); 
  freeFailures();
  m_testErrors = 0;
  m_tests.clear();
}